

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

void Abc_NodeConstantInput(Abc_Obj_t *pNode,Abc_Obj_t *pFanin,int fConst0)

{
  Abc_Ntk_t *pAVar1;
  DdManager *dd;
  DdNode *f;
  int i;
  DdNode *pDVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  pAVar1 = pNode->pNtk;
  if ((pAVar1->ntkFunc != ABC_FUNC_BDD) || (pAVar1->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                  ,0x247,"void Abc_NodeConstantInput(Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  lVar4 = (long)(pNode->vFanins).nSize;
  i = -1;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      if ((pNode->vFanins).pArray[lVar5] == pFanin->Id) {
        i = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  if (i == -1) {
    pcVar3 = Abc_ObjName(pFanin);
    printf("Node %s should be among",pcVar3);
    pcVar3 = Abc_ObjName(pNode);
    printf(" the fanins of node %s...\n",pcVar3);
    return;
  }
  dd = (DdManager *)pAVar1->pManFunc;
  pDVar2 = Cudd_bddIthVar(dd,i);
  f = (DdNode *)(pNode->field_5).pData;
  pDVar2 = Cudd_Cofactor(dd,f,(DdNode *)((long)fConst0 ^ (ulong)pDVar2));
  (pNode->field_5).pData = pDVar2;
  Cudd_Ref(pDVar2);
  Cudd_RecursiveDeref(dd,f);
  return;
}

Assistant:

void Abc_NodeConstantInput( Abc_Obj_t * pNode, Abc_Obj_t * pFanin, int fConst0 )
{
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bVar, * bTemp;
    int iFanin;
    assert( Abc_NtkIsBddLogic(pNode->pNtk) ); 
    if ( (iFanin = Vec_IntFind( &pNode->vFanins, pFanin->Id )) == -1 )
    {
        printf( "Node %s should be among", Abc_ObjName(pFanin) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNode) );
        return;
    }
    bVar = Cudd_NotCond( Cudd_bddIthVar(dd, iFanin), fConst0 );
    pNode->pData = Cudd_Cofactor( dd, bTemp = (DdNode *)pNode->pData, bVar );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( dd, bTemp );
}